

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O2

void do_medit(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  MOB_INDEX_DATA *pMVar5;
  char *pcVar6;
  AREA_DATA_conflict *pAVar7;
  char *pcVar8;
  char arg1 [4608];
  char local_1228 [4616];
  
  bVar2 = check_security(ch);
  if (!bVar2) {
    return;
  }
  pcVar4 = one_argument(argument,local_1228);
  bVar2 = is_number(local_1228);
  if (bVar2) {
    iVar3 = atoi(local_1228);
    pMVar5 = get_mob_index(iVar3);
    if (pMVar5 == (MOB_INDEX_DATA *)0x0) {
      pcVar4 = "MEdit:  That vnum does not exist.\n\r";
      goto LAB_00399c60;
    }
    bVar2 = is_switched(ch);
    if (!bVar2) {
      if (pMVar5->area->security < ch->pcdata->security) {
LAB_00399cc3:
        pDVar1 = ch->desc;
        pDVar1->pEdit = pMVar5;
        pDVar1->editor = 4;
        medit_show(ch,"");
        return;
      }
      pcVar4 = pMVar5->area->builders;
      pcVar6 = strstr(pcVar4,ch->name);
      if ((pcVar6 != (char *)0x0) || (pcVar4 = strstr(pcVar4,"All"), pcVar4 != (char *)0x0))
      goto LAB_00399cc3;
    }
  }
  else {
    bVar2 = str_cmp(local_1228,"create");
    if (bVar2) {
      pcVar4 = "MEdit:  There is no default mobile to edit.\n\r";
      goto LAB_00399c60;
    }
    iVar3 = atoi(pcVar4);
    if (iVar3 == 0 || local_1228[0] == '\0') {
      pcVar4 = "Syntax:  edit mobile create [vnum]\n\r";
      goto LAB_00399c60;
    }
    pAVar7 = get_vnum_area(iVar3);
    if (pAVar7 == (AREA_DATA_conflict *)0x0) {
      pcVar4 = "MEdit:  That vnum is not assigned an area.\n\r";
      goto LAB_00399c60;
    }
    bVar2 = is_switched(ch);
    if (!bVar2) {
      if (pAVar7->security < ch->pcdata->security) {
LAB_00399d5b:
        bVar2 = medit_create(ch,pcVar4);
        if (!bVar2) {
          return;
        }
        *(byte *)pAVar7->area_flags = (byte)pAVar7->area_flags[0] | 8;
        ch->desc->editor = 4;
        return;
      }
      pcVar6 = pAVar7->builders;
      pcVar8 = strstr(pcVar6,ch->name);
      if ((pcVar8 != (char *)0x0) || (pcVar6 = strstr(pcVar6,"All"), pcVar6 != (char *)0x0))
      goto LAB_00399d5b;
    }
  }
  pcVar4 = "Insufficient security to modify mobs.\n\r";
LAB_00399c60:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_medit(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	AREA_DATA *pArea;
	int value;
	char arg1[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	if (is_number(arg1))
	{
		value = atoi(arg1);
		if (!(pMob = get_mob_index(value)))
		{
			send_to_char("MEdit:  That vnum does not exist.\n\r", ch);
			return;
		}

		if (!IS_BUILDER(ch, pMob->area))
		{
			send_to_char("Insufficient security to modify mobs.\n\r", ch);
			return;
		}

		ch->desc->pEdit = (void *)pMob;
		ch->desc->editor = ED_MOBILE;

		medit_show(ch, "");
		return;
	}
	else
	{
		if (!str_cmp(arg1, "create"))
		{
			value = atoi(argument);

			if (arg1[0] == '\0' || value == 0)
			{
				send_to_char("Syntax:  edit mobile create [vnum]\n\r", ch);
				return;
			}

			pArea = get_vnum_area(value);

			if (!pArea)
			{
				send_to_char("MEdit:  That vnum is not assigned an area.\n\r", ch);
				return;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("Insufficient security to modify mobs.\n\r", ch);
				return;
			}

			if (medit_create(ch, argument))
			{
				SET_BIT(pArea->area_flags, AREA_CHANGED);
				ch->desc->editor = ED_MOBILE;
			}

			return;
		}
	}

	send_to_char("MEdit:  There is no default mobile to edit.\n\r", ch);
}